

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O2

int lyb_parse_subtree(char *data,lyd_node *parent,lyd_node **first_sibling,char *yang_data_name,
                     int options,unres_data *unres,lyb_state *lybs)

{
  undefined1 *buf;
  lyd_node *plVar1;
  lyd_node *plVar2;
  lys_node *plVar3;
  lys_type_enum *plVar4;
  lyd_attr *plVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  lys_module *plVar12;
  lyd_node_leaf_list *plVar13;
  lys_ext_instance ***ppplVar14;
  lyd_attr *plVar15;
  undefined8 *puVar16;
  hash_table *phVar17;
  lyd_node **pplVar18;
  LYS_NODE LVar19;
  ulong uVar20;
  lyd_val *plVar21;
  size_t count_00;
  uint8_t *puVar22;
  long lVar23;
  int iVar24;
  lys_ext_instance_complex *plVar25;
  char *pcVar26;
  lys_submodule *plVar27;
  bool bVar28;
  size_t sStackY_d0;
  lys_module *local_b0;
  lys_module *local_a8;
  lys_module *mod;
  uint local_94;
  lys_node *local_90;
  lys_node *snode;
  lys_ext_instance ***local_80;
  lyd_attr *local_78;
  lyd_node **local_70;
  int local_68;
  uint local_64;
  char *local_60;
  lyd_node *local_58;
  uint8_t *local_50;
  int local_44;
  uint local_40;
  byte local_39;
  lyd_node_leaf_list *plStack_38;
  uint8_t count;
  
  snode = (lys_node *)unres;
  local_58 = parent;
  local_40 = options;
  if ((parent == (lyd_node *)0x0) != (first_sibling != (lyd_node **)0x0)) {
    __assert_fail("(parent && !first_sibling) || (!parent && first_sibling)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                  ,0x3f8,
                  "int lyb_parse_subtree(const char *, struct lyd_node *, struct lyd_node **, const char *, int, struct unres_data *, struct lyb_state *)"
                 );
  }
  uVar7 = lyb_read_start_subtree(data,lybs);
  plVar1 = local_58;
  if (-1 < (int)uVar7) {
    pcVar26 = data + uVar7;
    if (local_58 == (lyd_node *)0x0) {
      uVar8 = lyb_parse_model(pcVar26,&local_a8,lybs);
      if (-1 < (int)uVar8) {
        uVar7 = uVar7 + uVar8;
        pcVar26 = pcVar26 + uVar8;
        if (local_a8 != (lys_module *)0x0) {
          uVar8 = lyb_parse_schema_hash
                            ((lys_node *)0x0,local_a8,pcVar26,yang_data_name,local_40,&local_90,lybs
                            );
          bVar28 = true;
          goto LAB_0014020a;
        }
        iVar24 = uVar7 + uVar8;
        plVar12 = (lys_module *)(pcVar26 + uVar8);
LAB_001402d5:
        iVar10 = lyb_skip_subtree((char *)plVar12,lybs);
        if (-1 < iVar10) {
          iVar24 = iVar24 + iVar10;
          goto LAB_001402e7;
        }
      }
    }
    else {
      plVar12 = lyd_node_module(local_58);
      local_a8 = plVar12;
      uVar8 = lyb_parse_schema_hash
                        (plVar1->schema,(lys_module *)0x0,pcVar26,(char *)0x0,local_40,&local_90,
                         lybs);
      bVar28 = plVar12 != (lys_module *)0x0;
LAB_0014020a:
      plVar3 = local_90;
      if (-1 < (int)uVar8) {
        iVar24 = uVar7 + uVar8;
        plVar12 = (lys_module *)(pcVar26 + uVar8);
        if (!(bool)(bVar28 & local_90 != (lys_node *)0x0)) goto LAB_001402d5;
        LVar19 = local_90->nodetype;
        local_70 = first_sibling;
        if (LVar19 == LYS_CONTAINER) goto LAB_0014027b;
        if ((LVar19 == LYS_LEAF) || (LVar19 == LYS_LEAFLIST)) {
          plVar13 = (lyd_node_leaf_list *)calloc(0x50,1);
          if (*(int *)&plVar3[1].ref != 9) goto LAB_00140330;
          plVar13->validity = '\b';
        }
        else {
          if (LVar19 == LYS_LIST) {
LAB_0014027b:
            sStackY_d0 = 0x48;
          }
          else {
            if (LVar19 != LYS_ANYXML) {
              if ((LVar19 != LYS_NOTIF) && (LVar19 != LYS_RPC)) {
                if (LVar19 == LYS_ANYDATA) goto LAB_00140322;
                if (LVar19 != LYS_ACTION) goto LAB_001402f1;
              }
              goto LAB_0014027b;
            }
LAB_00140322:
            sStackY_d0 = 0x40;
          }
          plVar13 = (lyd_node_leaf_list *)calloc(sStackY_d0,1);
LAB_00140330:
          if (plVar13 == (lyd_node_leaf_list *)0x0) {
            ly_log(plVar3->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lyb_new_node");
            plVar13 = (lyd_node_leaf_list *)0x0;
            first_sibling = local_70;
            goto LAB_001402f3;
          }
        }
        plVar13->schema = plVar3;
        local_44 = iVar24;
        iVar24 = resolve_applies_when(plVar3,0,(lys_node *)0x0);
        if (iVar24 != 0) {
          plVar13->field_0x9 = plVar13->field_0x9 & 0xf1 | 0xc;
        }
        plVar13->prev = (lyd_node *)plVar13;
        local_39 = 0;
        mod = plVar12;
        plStack_38 = plVar13;
        uVar7 = lyb_read((char *)plVar12,&local_39,1,lybs);
        first_sibling = local_70;
        if ((int)uVar7 < 0) {
LAB_00140842:
          plVar13 = plStack_38;
          lyd_free_attr(lybs->ctx,(lyd_node *)plStack_38,plStack_38->attr,1);
          goto LAB_001402f3;
        }
        puVar22 = mod->padding2 + ((ulong)uVar7 - 0x42);
        local_78 = (lyd_attr *)0x0;
        for (bVar6 = 0; bVar6 < local_39; bVar6 = bVar6 + 1) {
          uVar8 = lyb_read_start_subtree((char *)puVar22,lybs);
          if ((int)uVar8 < 0) goto LAB_00140842;
          uVar9 = lyb_parse_model((char *)(puVar22 + uVar8),&local_b0,lybs);
          plVar12 = local_b0;
          if ((int)uVar9 < 0) goto LAB_00140842;
          uVar7 = uVar8 + uVar7 + uVar9;
          puVar22 = puVar22 + uVar8 + uVar9;
          if (local_b0 == (lys_module *)0x0) {
LAB_00140634:
            count_00 = lybs->written[(long)lybs->used + -1];
            do {
              uVar8 = lyb_read((char *)puVar22,(uint8_t *)0x0,count_00,lybs);
              if ((int)uVar8 < 0) goto LAB_00140842;
              uVar7 = uVar7 + uVar8;
              puVar22 = puVar22 + uVar8;
              count_00 = lybs->written[(long)lybs->used + -1];
            } while (count_00 != 0);
          }
          else {
            local_60 = (char *)0x0;
            local_94 = uVar7;
            uVar7 = lyb_read_string((char *)puVar22,&local_60,1,lybs);
            pcVar26 = local_60;
            if ((int)uVar7 < 0) goto LAB_00140842;
            local_80 = &plVar12->ext;
            iVar24 = 0;
            local_64 = uVar7;
            local_50 = puVar22;
            while( true ) {
              if (((int)(uint)plVar12->ext_size <= iVar24) ||
                 (iVar10 = lys_ext_instance_presence
                                     ((*(plVar12->ctx->models).list)->extensions,
                                      plVar12->ext + iVar24,plVar12->ext_size - (char)iVar24),
                 iVar10 == -1)) goto LAB_001404c0;
              iVar10 = iVar10 + iVar24;
              lVar23 = (long)iVar10;
              iVar24 = ly_strequal_((*local_80)[lVar23]->arg_value,pcVar26);
              if (iVar24 != 0) break;
              iVar24 = iVar10 + 1;
            }
            ppplVar14 = local_80;
            if (iVar10 != -1) goto LAB_0014058a;
LAB_001404c0:
            local_68 = -1;
            plVar27 = (lys_submodule *)0x0;
            for (uVar20 = 0; uVar20 < plVar12->inc_size; uVar20 = uVar20 + 1) {
              plVar27 = plVar12->inc[uVar20].submodule;
              iVar24 = 0;
              while ((iVar10 = local_68, iVar24 < (int)(uint)plVar27->ext_size &&
                     (iVar11 = lys_ext_instance_presence
                                         ((*(plVar12->ctx->models).list)->extensions,
                                          plVar27->ext + iVar24,plVar27->ext_size - (char)iVar24),
                     iVar10 = local_68, iVar11 != -1))) {
                iVar10 = iVar11 + iVar24;
                iVar24 = ly_strequal_(plVar27->ext[iVar10]->arg_value,pcVar26);
                if (iVar24 != 0) break;
                iVar24 = iVar10 + 1;
              }
              local_68 = iVar10;
            }
            first_sibling = local_70;
            if (local_68 == -1) {
              plVar25 = (lys_ext_instance_complex *)0x0;
            }
            else {
              ppplVar14 = local_80;
              if (plVar27 != (lys_submodule *)0x0) {
                ppplVar14 = &plVar27->ext;
              }
              lVar23 = (long)local_68;
LAB_0014058a:
              plVar25 = (lys_ext_instance_complex *)(*ppplVar14)[lVar23];
            }
            if (((local_40 >> 9 & 1) != 0) && (plVar25 == (lys_ext_instance_complex *)0x0)) {
              ly_vlog(plVar12->ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                      "Failed to find annotation \"%s\" in \"%s\".",pcVar26,plVar12->name);
              local_64 = 0xffffffff;
            }
            free(pcVar26);
            plVar13 = plStack_38;
            plVar5 = local_78;
            if ((int)local_64 < 0) goto LAB_00140842;
            uVar7 = local_94 + local_64;
            puVar22 = local_50 + local_64;
            local_50 = puVar22;
            if ((plVar25 == (lys_ext_instance_complex *)0x0) || (local_b0 == (lys_module *)0x0))
            goto LAB_00140634;
            if (local_78 == (lyd_attr *)0x0) {
              if (plStack_38->attr != (lyd_attr *)0x0) {
                __assert_fail("!node->attr",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                              ,0x348,
                              "int lyb_parse_attributes(struct lyd_node *, const char *, int, struct unres_data *, struct lyb_state *)"
                             );
              }
              plVar15 = (lyd_attr *)calloc(1,0x38);
              if (plVar15 == (lyd_attr *)0x0) goto LAB_00140824;
              plVar13->attr = plVar15;
            }
            else {
              plVar15 = (lyd_attr *)calloc(1,0x38);
              plVar5->next = plVar15;
              if (plVar15 == (lyd_attr *)0x0) {
LAB_00140824:
                ly_log(lybs->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                       "lyb_parse_attributes");
                goto LAB_00140842;
              }
            }
            plVar15->annotation = plVar25;
            pcVar26 = lydict_insert(lybs->ctx,plVar25->arg_value,0);
            plVar15->name = pcVar26;
            local_78 = plVar15;
            puVar16 = (undefined8 *)
                      lys_ext_complex_get_substmt
                                (LY_STMT_TYPE,plVar15->annotation,(lyext_substmt **)0x0);
            puVar22 = local_50;
            if (((puVar16 == (undefined8 *)0x0) || ((lys_type *)*puVar16 == (lys_type *)0x0)) ||
               (uVar8 = lyb_parse_value((lys_type *)*puVar16,(lyd_node_leaf_list *)0x0,local_78,
                                        (char *)local_50,(unres_data *)snode,lybs), (int)uVar8 < 0))
            goto LAB_00140842;
            uVar7 = uVar7 + uVar8;
            puVar22 = puVar22 + uVar8;
          }
          lyb_read_stop_subtree(lybs);
        }
        plVar13 = plStack_38;
        if ((int)uVar7 < 0) goto LAB_001402f3;
        iVar24 = local_44 + uVar7;
        puVar22 = mod->padding2 + ((ulong)uVar7 - 0x42);
        LVar19 = local_90->nodetype;
        local_44 = iVar24;
        if (LVar19 != LYS_CONTAINER) {
          if (LVar19 == LYS_LEAF) {
LAB_001407ed:
            uVar7 = lyb_parse_value((lys_type *)&plStack_38->schema[1].ref,plStack_38,
                                    (lyd_attr *)0x0,(char *)puVar22,(unres_data *)snode,lybs);
            plVar13 = plStack_38;
            if ((int)uVar7 < 0) goto LAB_001402f3;
            iVar24 = iVar24 + uVar7;
            puVar22 = puVar22 + uVar7;
          }
          else if (LVar19 == LYS_ANYDATA) {
LAB_0014085e:
            local_60 = (char *)0x0;
            buf = &plStack_38->field_0x34;
            uVar7 = lyb_read((char *)puVar22,buf,4,lybs);
            plVar13 = plStack_38;
            if ((int)uVar7 < 0) goto LAB_001402f3;
            iVar10 = *(int *)buf;
            if (iVar10 == 0x20) {
              iVar10 = lyb_read_string((char *)(puVar22 + uVar7),&plStack_38->value_str,0,lybs);
              plVar13 = plStack_38;
              if (iVar10 < 0) goto LAB_001402f3;
            }
            else {
              if (iVar10 == 0x10) {
                ly_log(plStack_38->schema->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                       ,0x15a);
                plVar13 = plStack_38;
                goto LAB_001402f3;
              }
              iVar10 = lyb_read_string((char *)(puVar22 + uVar7),&local_60,0,lybs);
              plVar13 = plStack_38;
              if (iVar10 < 0) goto LAB_001402f3;
              phVar17 = (hash_table *)lydict_insert_zc(plStack_38->schema->module->ctx,local_60);
              plStack_38->value_str = (char *)phVar17;
            }
            iVar24 = iVar24 + iVar10 + uVar7;
            puVar22 = puVar22 + (iVar10 + uVar7);
          }
          else if (LVar19 != LYS_LIST) {
            if (LVar19 == LYS_ANYXML) goto LAB_0014085e;
            if (((LVar19 != LYS_NOTIF) && (LVar19 != LYS_RPC)) && (LVar19 != LYS_ACTION)) {
              if (LVar19 != LYS_LEAFLIST) goto LAB_001402f3;
              goto LAB_001407ed;
            }
          }
        }
        if (local_58 == (lyd_node *)0x0) {
          if (*first_sibling == (lyd_node *)0x0) {
            *first_sibling = (lyd_node *)plStack_38;
          }
          else {
            (*first_sibling)->prev->next = (lyd_node *)plStack_38;
            plStack_38->prev = (*first_sibling)->prev;
            (*first_sibling)->prev = (lyd_node *)plStack_38;
          }
        }
        else {
          plVar1 = local_58->child;
          if (plVar1 == (lyd_node *)0x0) {
            pplVar18 = &local_58->child;
          }
          else {
            plVar2 = plVar1->prev;
            pplVar18 = &plVar1->prev;
            plVar2->next = (lyd_node *)plStack_38;
            plStack_38->prev = plVar2;
          }
          *pplVar18 = (lyd_node *)plStack_38;
          plStack_38->parent = local_58;
        }
        while (plVar13 = plStack_38, lybs->written[(long)lybs->used + -1] != 0) {
          uVar7 = lyb_parse_subtree((char *)puVar22,(lyd_node *)plStack_38,(lyd_node **)0x0,
                                    (char *)0x0,local_40,(unres_data *)snode,lybs);
          plVar13 = plStack_38;
          if ((int)uVar7 < 0) goto LAB_001402f3;
          iVar24 = iVar24 + uVar7;
          puVar22 = puVar22 + uVar7;
        }
        plVar3 = plStack_38->schema;
        LVar19 = plVar3->nodetype;
        if (LVar19 == LYS_CONTAINER) {
          lVar23._0_2_ = plVar3[1].flags;
          lVar23._2_1_ = plVar3[1].ext_size;
          lVar23._3_1_ = plVar3[1].iffeature_size;
          lVar23._4_1_ = plVar3[1].padding[0];
          lVar23._5_1_ = plVar3[1].padding[1];
          lVar23._6_1_ = plVar3[1].padding[2];
          lVar23._7_1_ = plVar3[1].padding[3];
          if (lVar23 == 0) {
            plVar21 = &plStack_38->value;
            do {
              plVar4 = plVar21->enm;
              if (plVar4 == (lys_type_enum *)0x0) {
                plStack_38->field_0x9 = plStack_38->field_0x9 | 1;
                LVar19 = plVar3->nodetype;
                goto LAB_00140a25;
              }
              plVar21 = (lyd_val *)&plVar4->flags;
            } while (((ulong)plVar4->dsc & 0x100) != 0);
          }
        }
        else {
LAB_00140a25:
          if ((LVar19 == LYS_LIST) && (plVar3->padding[2] != '\0')) goto LAB_001402e7;
        }
        lyd_hash((lyd_node *)plStack_38);
        lyd_insert_hash((lyd_node *)plVar13);
LAB_001402e7:
        lyb_read_stop_subtree(lybs);
        return iVar24;
      }
    }
  }
LAB_001402f1:
  plVar13 = (lyd_node_leaf_list *)0x0;
LAB_001402f3:
  lyd_free((lyd_node *)plVar13);
  if ((first_sibling != (lyd_node **)0x0) && ((lyd_node_leaf_list *)*first_sibling == plVar13)) {
    *first_sibling = (lyd_node *)0x0;
  }
  return -1;
}

Assistant:

static int
lyb_parse_subtree(const char *data, struct lyd_node *parent, struct lyd_node **first_sibling, const char *yang_data_name,
        int options, struct unres_data *unres, struct lyb_state *lybs)
{
    int r, ret = 0;
    struct lyd_node *node = NULL, *iter;
    const struct lys_module *mod;
    struct lys_node *snode;

    assert((parent && !first_sibling) || (!parent && first_sibling));

    /* register a new subtree */
    ret += (r = lyb_read_start_subtree(data, lybs));
    LYB_HAVE_READ_GOTO(r, data, error);

    if (!parent) {
        /* top-level, read module name */
        ret += (r = lyb_parse_model(data, &mod, lybs));
        LYB_HAVE_READ_GOTO(r, data, error);

        if (mod) {
            /* read hash, find the schema node starting from mod, possibly yang_data_name */
            r = lyb_parse_schema_hash(NULL, mod, data, yang_data_name, options, &snode, lybs);
        }
    } else {
        mod = lyd_node_module(parent);

        /* read hash, find the schema node starting from parent schema */
        r = lyb_parse_schema_hash(parent->schema, NULL, data, NULL, options, &snode, lybs);
    }
    ret += r;
    LYB_HAVE_READ_GOTO(r, data, error);

    if (!mod || !snode) {
        /* unknown data subtree, skip it whole */
        ret += (r = lyb_skip_subtree(data, lybs));
        LYB_HAVE_READ_GOTO(r, data, error);
        goto stop_subtree;
    }

    /*
     * read the node
     */
    node = lyb_new_node(snode);
    if (!node) {
        goto error;
    }

    ret += (r = lyb_parse_attributes(node, data, options, unres, lybs));
    LYB_HAVE_READ_GOTO(r, data, error);

    /* read node content */
    switch (snode->nodetype) {
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_NOTIF:
    case LYS_RPC:
    case LYS_ACTION:
        /* nothing to read */
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
        ret += (r = lyb_parse_value(&((struct lys_node_leaf *)node->schema)->type, (struct lyd_node_leaf_list *)node,
                                    NULL, data, unres, lybs));
        LYB_HAVE_READ_GOTO(r, data, error);
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        ret += (r = lyb_parse_anydata(node, data, lybs));
        LYB_HAVE_READ_GOTO(r, data, error);
        break;
    default:
        goto error;
    }

    /* insert into data tree, manually */
    if (parent) {
        if (!parent->child) {
            /* only child */
            parent->child = node;
        } else {
            /* last child */
            parent->child->prev->next = node;
            node->prev = parent->child->prev;
            parent->child->prev = node;
        }
        node->parent = parent;
    } else if (*first_sibling) {
        /* last sibling */
        (*first_sibling)->prev->next = node;
        node->prev = (*first_sibling)->prev;
        (*first_sibling)->prev = node;
    } else {
        /* only sibling */
        *first_sibling = node;
    }

    /* read all descendants */
    while (lybs->written[lybs->used - 1]) {
        ret += (r = lyb_parse_subtree(data, node, NULL, NULL, options, unres, lybs));
        LYB_HAVE_READ_GOTO(r, data, error);
    }

    /* make containers default if should be */
    if ((node->schema->nodetype == LYS_CONTAINER) && !((struct lys_node_container *)node->schema)->presence) {
        LY_TREE_FOR(node->child, iter) {
            if (!iter->dflt) {
                break;
            }
        }

        if (!iter) {
            node->dflt = 1;
        }
    }

#ifdef LY_ENABLED_CACHE
    /* calculate the hash and insert it into parent (list with keys is handled when its keys are inserted) */
    if ((node->schema->nodetype != LYS_LIST) || !((struct lys_node_list *)node->schema)->keys_size) {
        lyd_hash(node);
        lyd_insert_hash(node);
    }
#endif

stop_subtree:
    /* end the subtree */
    lyb_read_stop_subtree(lybs);

    return ret;

error:
    lyd_free(node);
    if (first_sibling && (*first_sibling == node)) {
        *first_sibling = NULL;
    }
    return -1;
}